

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

int lodepng_pixel_overflow(uint w,uint h,LodePNGColorMode *pngcolor,LodePNGColorMode *rawcolor)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint in_ESI;
  uint in_EDI;
  size_t line;
  size_t total;
  size_t numpixels;
  size_t bpp;
  uint local_48;
  size_t local_40;
  size_t local_38;
  size_t local_30;
  ulong local_28;
  uint local_c;
  uint local_8;
  int local_4;
  
  local_c = in_ESI;
  local_8 = in_EDI;
  uVar1 = lodepng_get_bpp((LodePNGColorMode *)0x139580);
  uVar2 = lodepng_get_bpp((LodePNGColorMode *)0x13958e);
  if (uVar2 < uVar1) {
    local_48 = lodepng_get_bpp((LodePNGColorMode *)0x1395a2);
  }
  else {
    local_48 = lodepng_get_bpp((LodePNGColorMode *)0x1395b1);
  }
  local_28 = (ulong)local_48;
  iVar3 = lodepng_mulofl((ulong)local_8,(ulong)local_c,&local_30);
  if (iVar3 == 0) {
    iVar3 = lodepng_mulofl(local_30,8,&local_38);
    if (iVar3 == 0) {
      iVar3 = lodepng_mulofl((ulong)(local_8 >> 3),local_28,&local_40);
      if (iVar3 == 0) {
        iVar3 = lodepng_addofl(local_40,(local_8 & 7) * local_28 + 7 >> 3,&local_40);
        if (iVar3 == 0) {
          iVar3 = lodepng_addofl(local_40,5,&local_40);
          if (iVar3 == 0) {
            iVar3 = lodepng_mulofl(local_40,(ulong)local_c,&local_38);
            if (iVar3 == 0) {
              local_4 = 0;
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int lodepng_pixel_overflow(unsigned w, unsigned h,
                                  const LodePNGColorMode* pngcolor, const LodePNGColorMode* rawcolor) {
  size_t bpp = LODEPNG_MAX(lodepng_get_bpp(pngcolor), lodepng_get_bpp(rawcolor));
  size_t numpixels, total;
  size_t line; /* bytes per line in worst case */

  if(lodepng_mulofl((size_t)w, (size_t)h, &numpixels)) return 1;
  if(lodepng_mulofl(numpixels, 8, &total)) return 1; /* bit pointer with 8-bit color, or 8 bytes per channel color */

  /* Bytes per scanline with the expression "(w / 8u) * bpp) + ((w & 7u) * bpp + 7u) / 8u" */
  if(lodepng_mulofl((size_t)(w / 8u), bpp, &line)) return 1;
  if(lodepng_addofl(line, ((w & 7u) * bpp + 7u) / 8u, &line)) return 1;

  if(lodepng_addofl(line, 5, &line)) return 1; /* 5 bytes overhead per line: 1 filterbyte, 4 for Adam7 worst case */
  if(lodepng_mulofl(line, h, &total)) return 1; /* Total bytes in worst case */

  return 0; /* no overflow */
}